

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchArg.h
# Opt level: O1

bool __thiscall TCLAP::SwitchArg::combinedSwitchesMatch(SwitchArg *this,string *combinedSwitches)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  undefined2 *local_b0;
  long local_a8;
  undefined2 local_a0;
  undefined6 uStack_9e;
  undefined2 *local_90;
  undefined8 local_88;
  undefined2 local_80;
  undefined1 uStack_7e;
  undefined5 uStack_7d;
  undefined2 *local_70;
  undefined8 local_68;
  undefined2 local_60 [8];
  undefined2 *local_50;
  undefined8 local_48;
  undefined2 local_40;
  undefined1 local_3e;
  
  if (combinedSwitches->_M_string_length == 0) {
    bVar7 = false;
  }
  else {
    local_70 = local_60;
    local_60[0] = 0x2d;
    local_68 = 1;
    bVar7 = *(combinedSwitches->_M_dataplus)._M_p != '-';
  }
  if (!bVar7) {
    local_80 = 0x2d2d;
    local_88 = 2;
    uStack_7e = 0;
    local_90 = &local_80;
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)combinedSwitches);
    local_50 = &local_40;
    local_40 = 0x2d2d;
    local_48 = 2;
    local_3e = 0;
    if (local_a8 == 2) {
      iVar3 = bcmp(local_b0,local_50,2);
      bVar7 = iVar3 == 0;
    }
    else {
      bVar7 = false;
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,CONCAT62(uStack_9e,local_a0) + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,CONCAT53(uStack_7d,CONCAT12(uStack_7e,local_80)) + 1);
    }
    if (!bVar7) {
      lVar4 = std::__cxx11::string::find
                        ((char)combinedSwitches,(ulong)(uint)(int)Arg::delimiterRef()::delim);
      if (lVar4 != -1) {
        return false;
      }
      bVar7 = 1 < combinedSwitches->_M_string_length;
      if (!bVar7) {
        return bVar7;
      }
      uVar6 = 1;
      uVar5 = 2;
      while( true ) {
        if (((this->super_Arg)._flag._M_string_length == 0) ||
           (cVar1 = *(this->super_Arg)._flag._M_dataplus._M_p,
           (combinedSwitches->_M_dataplus)._M_p[uVar6] != cVar1)) {
          bVar2 = false;
          bVar8 = false;
        }
        else {
          local_b0 = &local_a0;
          local_a0 = 0x2d;
          local_a8 = 1;
          bVar8 = cVar1 != '-';
          bVar2 = true;
        }
        if ((bVar2) && (local_b0 != &local_a0)) {
          operator_delete(local_b0,CONCAT62(uStack_9e,local_a0) + 1);
        }
        if (bVar8) break;
        uVar6 = (ulong)uVar5;
        uVar5 = uVar5 + 1;
        bVar7 = uVar6 < combinedSwitches->_M_string_length;
        if (combinedSwitches->_M_string_length <= uVar6) {
          return bVar7;
        }
      }
      (combinedSwitches->_M_dataplus)._M_p[uVar6] = '\a';
      return bVar7;
    }
  }
  return false;
}

Assistant:

inline bool SwitchArg::combinedSwitchesMatch(std::string& combinedSwitches )
{
	// make sure this is actually a combined switch
	if ( combinedSwitches.length() > 0 &&
	     combinedSwitches[0] != Arg::flagStartString()[0] )
		return false;

	// make sure it isn't a long name 
	if ( combinedSwitches.substr( 0, Arg::nameStartString().length() ) == 
	     Arg::nameStartString() )
		return false;

	// make sure the delimiter isn't in the string 
	if ( combinedSwitches.find_first_of( Arg::delimiter() ) != std::string::npos )
		return false;

	// ok, we're not specifying a ValueArg, so we know that we have
	// a combined switch list.  
	for ( unsigned int i = 1; i < combinedSwitches.length(); i++ )
		if ( _flag.length() > 0 && 
		     combinedSwitches[i] == _flag[0] &&
		     _flag[0] != Arg::flagStartString()[0] ) 
		{
			// update the combined switches so this one is no longer present
			// this is necessary so that no unlabeled args are matched
			// later in the processing.
			//combinedSwitches.erase(i,1);
			combinedSwitches[i] = Arg::blankChar(); 
			return true;
		}

	// none of the switches passed in the list match. 
	return false;	
}